

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

shared_ptr<kratos::EventTracingStmt> __thiscall
kratos::EventTracingStmt::terminates(EventTracingStmt *this,string *transaction_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::EventTracingStmt> sVar1;
  
  belongs((EventTracingStmt *)&stack0xffffffffffffffd8,transaction_name);
  terminates(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  sVar1.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::EventTracingStmt>)
         sVar1.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<EventTracingStmt> EventTracingStmt::terminates(
    const std::string &transaction_name) {
    return belongs(transaction_name)->terminates();
}